

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFJob.cc
# Opt level: O2

unique_ptr<QPDF,_std::default_delete<QPDF>_> __thiscall QPDFJob::createQPDF(QPDFJob *this)

{
  pointer puVar1;
  unique_ptr<QPDF,_std::default_delete<QPDF>_> oh;
  bool bVar2;
  element_type *peVar3;
  QPDFJob *in_RSI;
  unique_ptr<QPDF,_std::default_delete<QPDF>_> *foreign;
  pointer puVar4;
  allocator<char> local_c9;
  string local_c8;
  unique_ptr<QPDF,_std::default_delete<QPDF>_> pdf_sp;
  allocator<char> local_99;
  QPDFObjectHandle info;
  undefined1 local_78 [16];
  QPDFObjectHandle trailer;
  QPDFObjectHandle mod_date;
  vector<std::unique_ptr<QPDF,_std::default_delete<QPDF>_>,_std::allocator<std::unique_ptr<QPDF,_std::default_delete<QPDF>_>_>_>
  page_heap;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_28;
  
  checkConfiguration(in_RSI);
  pdf_sp._M_t.super___uniq_ptr_impl<QPDF,_std::default_delete<QPDF>_>._M_t.
  super__Tuple_impl<0UL,_QPDF_*,_std::default_delete<QPDF>_>.super__Head_base<0UL,_QPDF_*,_false>.
  _M_head_impl = (__uniq_ptr_data<QPDF,_std::default_delete<QPDF>,_true,_true>)
                 (__uniq_ptr_impl<QPDF,_std::default_delete<QPDF>_>)0x0;
  peVar3 = (in_RSI->m).super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  processFile(in_RSI,&pdf_sp,
              (peVar3->infilename).super___shared_ptr<char,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
              (peVar3->password).super___shared_ptr<char,_(__gnu_cxx::_Lock_policy)2>._M_ptr,true,
              true);
  oh = pdf_sp;
  bVar2 = QPDF::isEncrypted((QPDF *)pdf_sp._M_t.
                                    super___uniq_ptr_impl<QPDF,_std::default_delete<QPDF>_>._M_t.
                                    super__Tuple_impl<0UL,_QPDF_*,_std::default_delete<QPDF>_>.
                                    super__Head_base<0UL,_QPDF_*,_false>._M_head_impl);
  peVar3 = (in_RSI->m).super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (bVar2) {
    peVar3->encryption_status = 1;
  }
  if ((peVar3->check_is_encrypted == false) && (peVar3->check_requires_password != true)) {
    if ((peVar3->update_from_json)._M_string_length != 0) {
      QPDF::updateFromJSON
                ((QPDF *)oh._M_t.super___uniq_ptr_impl<QPDF,_std::default_delete<QPDF>_>._M_t.
                         super__Tuple_impl<0UL,_QPDF_*,_std::default_delete<QPDF>_>.
                         super__Head_base<0UL,_QPDF_*,_false>._M_head_impl,&peVar3->update_from_json
                );
      peVar3 = (in_RSI->m).super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    }
    page_heap.
    super__Vector_base<std::unique_ptr<QPDF,_std::default_delete<QPDF>_>,_std::allocator<std::unique_ptr<QPDF,_std::default_delete<QPDF>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    page_heap.
    super__Vector_base<std::unique_ptr<QPDF,_std::default_delete<QPDF>_>,_std::allocator<std::unique_ptr<QPDF,_std::default_delete<QPDF>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    page_heap.
    super__Vector_base<std::unique_ptr<QPDF,_std::default_delete<QPDF>_>,_std::allocator<std::unique_ptr<QPDF,_std::default_delete<QPDF>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    if ((peVar3->page_specs).
        super__Vector_base<QPDFJob::PageSpec,_std::allocator<QPDFJob::PageSpec>_>._M_impl.
        super__Vector_impl_data._M_start !=
        *(pointer *)
         ((long)&(peVar3->page_specs).
                 super__Vector_base<QPDFJob::PageSpec,_std::allocator<QPDFJob::PageSpec>_>._M_impl.
                 super__Vector_impl_data + 8)) {
      handlePageSpecs(in_RSI,(QPDF *)oh._M_t.super___uniq_ptr_impl<QPDF,_std::default_delete<QPDF>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_QPDF_*,_std::default_delete<QPDF>_>.
                                     super__Head_base<0UL,_QPDF_*,_false>._M_head_impl,&page_heap);
      peVar3 = (in_RSI->m).super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    }
    if (*(size_t *)((long)&(peVar3->rotations)._M_t._M_impl.super__Rb_tree_header + 0x20) != 0) {
      handleRotations(in_RSI,(QPDF *)oh._M_t.super___uniq_ptr_impl<QPDF,_std::default_delete<QPDF>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_QPDF_*,_std::default_delete<QPDF>_>.
                                     super__Head_base<0UL,_QPDF_*,_false>._M_head_impl);
    }
    handleUnderOverlay(in_RSI,(QPDF *)oh._M_t.
                                      super___uniq_ptr_impl<QPDF,_std::default_delete<QPDF>_>._M_t.
                                      super__Tuple_impl<0UL,_QPDF_*,_std::default_delete<QPDF>_>.
                                      super__Head_base<0UL,_QPDF_*,_false>._M_head_impl);
    handleTransformations
              (in_RSI,(QPDF *)oh._M_t.super___uniq_ptr_impl<QPDF,_std::default_delete<QPDF>_>._M_t.
                              super__Tuple_impl<0UL,_QPDF_*,_std::default_delete<QPDF>_>.
                              super__Head_base<0UL,_QPDF_*,_false>._M_head_impl);
    peVar3 = (in_RSI->m).super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    if (peVar3->remove_info == true) {
      QPDF::getTrailer((QPDF *)&trailer);
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_c8,"/Info",&local_c9);
      QPDFObjectHandle::getKey((QPDFObjectHandle *)local_78,(string *)&trailer);
      std::__cxx11::string::string<std::allocator<char>>((string *)&info,"/ModDate",&local_99);
      QPDFObjectHandle::getKeyIfDict(&mod_date,(string *)local_78);
      std::__cxx11::string::~string((string *)&info);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_78 + 8));
      std::__cxx11::string::~string((string *)&local_c8);
      bVar2 = QPDFObjectHandle::isNull(&mod_date);
      if (bVar2) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_c8,"/Info",(allocator<char> *)&info);
        QPDFObjectHandle::removeKey(&trailer,&local_c8);
        std::__cxx11::string::~string((string *)&local_c8);
      }
      else {
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_c8,"/Info",&local_c9);
        QPDFObjectHandle::newDictionary();
        QPDF::makeIndirectObject
                  ((QPDF *)local_78,
                   (QPDFObjectHandle *)
                   oh._M_t.super___uniq_ptr_impl<QPDF,_std::default_delete<QPDF>_>._M_t.
                   super__Tuple_impl<0UL,_QPDF_*,_std::default_delete<QPDF>_>.
                   super__Head_base<0UL,_QPDF_*,_false>._M_head_impl);
        QPDFObjectHandle::replaceKeyAndGetNew
                  (&info,(string *)&trailer,(QPDFObjectHandle *)&local_c8);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_78 + 8));
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_28);
        std::__cxx11::string::~string((string *)&local_c8);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_c8,"/ModDate",(allocator<char> *)local_78);
        QPDFObjectHandle::replaceKey(&info,&local_c8,&mod_date);
        std::__cxx11::string::~string((string *)&local_c8);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&info.super_BaseHandle.obj.
                    super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
      }
      QPDF::getRoot((QPDF *)&info);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_c8,"/Metadata",(allocator<char> *)local_78);
      QPDFObjectHandle::removeKey(&info,&local_c8);
      std::__cxx11::string::~string((string *)&local_c8);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&info.super_BaseHandle.obj.
                  super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&mod_date.super_BaseHandle.obj.
                  super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&trailer.super_BaseHandle.obj.
                  super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
      peVar3 = (in_RSI->m).super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    }
    if (peVar3->remove_metadata == true) {
      QPDF::getRoot((QPDF *)&info);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_c8,"/Metadata",(allocator<char> *)&trailer);
      QPDFObjectHandle::removeKey(&info,&local_c8);
      std::__cxx11::string::~string((string *)&local_c8);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&info.super_BaseHandle.obj.
                  super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
      peVar3 = (in_RSI->m).super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    }
    puVar4 = page_heap.
             super__Vector_base<std::unique_ptr<QPDF,_std::default_delete<QPDF>_>,_std::allocator<std::unique_ptr<QPDF,_std::default_delete<QPDF>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    puVar1 = page_heap.
             super__Vector_base<std::unique_ptr<QPDF,_std::default_delete<QPDF>_>,_std::allocator<std::unique_ptr<QPDF,_std::default_delete<QPDF>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (peVar3->remove_structure == true) {
      QPDF::getRoot((QPDF *)&info);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_c8,"/StructTreeRoot",(allocator<char> *)&trailer);
      QPDFObjectHandle::removeKey(&info,&local_c8);
      std::__cxx11::string::~string((string *)&local_c8);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&info.super_BaseHandle.obj.
                  super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
      QPDF::getRoot((QPDF *)&info);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_c8,"/MarkInfo",(allocator<char> *)&trailer);
      QPDFObjectHandle::removeKey(&info,&local_c8);
      std::__cxx11::string::~string((string *)&local_c8);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&info.super_BaseHandle.obj.
                  super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
      puVar4 = page_heap.
               super__Vector_base<std::unique_ptr<QPDF,_std::default_delete<QPDF>_>,_std::allocator<std::unique_ptr<QPDF,_std::default_delete<QPDF>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      puVar1 = page_heap.
               super__Vector_base<std::unique_ptr<QPDF,_std::default_delete<QPDF>_>,_std::allocator<std::unique_ptr<QPDF,_std::default_delete<QPDF>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    }
    for (; puVar4 != puVar1; puVar4 = puVar4 + 1) {
      bVar2 = QPDF::anyWarnings((puVar4->_M_t).
                                super___uniq_ptr_impl<QPDF,_std::default_delete<QPDF>_>._M_t.
                                super__Tuple_impl<0UL,_QPDF_*,_std::default_delete<QPDF>_>.
                                super__Head_base<0UL,_QPDF_*,_false>._M_head_impl);
      if (bVar2) {
        ((in_RSI->m).super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
        warnings = true;
      }
    }
    (this->m).super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)
         pdf_sp._M_t.super___uniq_ptr_impl<QPDF,_std::default_delete<QPDF>_>._M_t.
         super__Tuple_impl<0UL,_QPDF_*,_std::default_delete<QPDF>_>.
         super__Head_base<0UL,_QPDF_*,_false>._M_head_impl;
    pdf_sp._M_t.super___uniq_ptr_impl<QPDF,_std::default_delete<QPDF>_>._M_t.
    super__Tuple_impl<0UL,_QPDF_*,_std::default_delete<QPDF>_>.super__Head_base<0UL,_QPDF_*,_false>.
    _M_head_impl = (__uniq_ptr_data<QPDF,_std::default_delete<QPDF>,_true,_true>)
                   (__uniq_ptr_impl<QPDF,_std::default_delete<QPDF>_>)0x0;
    std::
    vector<std::unique_ptr<QPDF,_std::default_delete<QPDF>_>,_std::allocator<std::unique_ptr<QPDF,_std::default_delete<QPDF>_>_>_>
    ::~vector(&page_heap);
  }
  else {
    (this->m).super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
  }
  std::unique_ptr<QPDF,_std::default_delete<QPDF>_>::~unique_ptr(&pdf_sp);
  return (__uniq_ptr_data<QPDF,_std::default_delete<QPDF>,_true,_true>)
         (__uniq_ptr_data<QPDF,_std::default_delete<QPDF>,_true,_true>)this;
}

Assistant:

std::unique_ptr<QPDF>
QPDFJob::createQPDF()
{
    checkConfiguration();
    std::unique_ptr<QPDF> pdf_sp;
    try {
        processFile(pdf_sp, m->infilename.get(), m->password.get(), true, true);
    } catch (QPDFExc& e) {
        if (e.getErrorCode() == qpdf_e_password) {
            // Allow certain operations to work when an incorrect password is supplied.
            if (m->check_is_encrypted || m->check_requires_password) {
                m->encryption_status = qpdf_es_encrypted | qpdf_es_password_incorrect;
                return nullptr;
            }
            if (m->show_encryption && pdf_sp) {
                m->log->info("Incorrect password supplied\n");
                showEncryption(*pdf_sp);
                return nullptr;
            }
        }
        throw;
    }
    QPDF& pdf = *pdf_sp;
    if (pdf.isEncrypted()) {
        m->encryption_status = qpdf_es_encrypted;
    }

    if (m->check_is_encrypted || m->check_requires_password) {
        return nullptr;
    }

    // If we are updating from JSON, this has to be done first before other options may cause
    // transformations to the input.
    if (!m->update_from_json.empty()) {
        pdf.updateFromJSON(m->update_from_json);
    }

    std::vector<std::unique_ptr<QPDF>> page_heap;
    if (!m->page_specs.empty()) {
        handlePageSpecs(pdf, page_heap);
    }
    if (!m->rotations.empty()) {
        handleRotations(pdf);
    }
    handleUnderOverlay(pdf);
    handleTransformations(pdf);
    if (m->remove_info) {
        auto trailer = pdf.getTrailer();
        auto mod_date = trailer.getKey("/Info").getKeyIfDict("/ModDate");
        if (mod_date.isNull()) {
            trailer.removeKey("/Info");
        } else {
            auto info = trailer.replaceKeyAndGetNew(
                "/Info", pdf.makeIndirectObject(QPDFObjectHandle::newDictionary()));
            info.replaceKey("/ModDate", mod_date);
        }
        pdf.getRoot().removeKey("/Metadata");
    }
    if (m->remove_metadata) {
        pdf.getRoot().removeKey("/Metadata");
    }
    if (m->remove_structure) {
        pdf.getRoot().removeKey("/StructTreeRoot");
        pdf.getRoot().removeKey("/MarkInfo");
    }

    for (auto& foreign: page_heap) {
        if (foreign->anyWarnings()) {
            m->warnings = true;
        }
    }
    return pdf_sp;
}